

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall QAbstractSocketPrivate::_q_testConnection(QAbstractSocketPrivate *this)

{
  bool bVar1;
  SocketState SVar2;
  SocketError error;
  QAbstractSocket *pQVar3;
  QAbstractSocketPrivate *in_RDI;
  QAbstractSocketPrivate *this_00;
  
  this_00 = in_RDI;
  if (in_RDI->connectTimer != (QTimer *)0x0) {
    QTimer::stop();
  }
  if (in_RDI->socketEngine != (QAbstractSocketEngine *)0x0) {
    SVar2 = QAbstractSocketEngine::state((QAbstractSocketEngine *)0x250196);
    if (SVar2 == ConnectedState) {
      fetchConnectionParameters(this_00);
      if ((in_RDI->pendingClose & 1U) == 0) {
        return;
      }
      pQVar3 = q_func(in_RDI);
      (**(code **)(*(long *)pQVar3 + 0x100))();
      in_RDI->pendingClose = false;
      return;
    }
    error = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x2501e8);
    bVar1 = isProxyError(error);
    if (bVar1) {
      QList<QHostAddress>::clear((QList<QHostAddress> *)in_RDI);
    }
  }
  _q_connectToNextAddress(this);
  return;
}

Assistant:

void QAbstractSocketPrivate::_q_testConnection()
{
    if (connectTimer)
        connectTimer->stop();

    if (socketEngine) {
        if (socketEngine->state() == QAbstractSocket::ConnectedState) {
            // Fetch the parameters if our connection is completed;
            // otherwise, fall out and try the next address.
            fetchConnectionParameters();
            if (pendingClose) {
                q_func()->disconnectFromHost();
                pendingClose = false;
            }
            return;
        }

        // don't retry the other addresses if we had a proxy error
        if (isProxyError(socketEngine->error()))
            addresses.clear();
    }

#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::_q_testConnection() connection failed,"
           " checking for alternative addresses");
#endif
    _q_connectToNextAddress();
}